

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O2

void __thiscall pybind11::detail::local_internals::local_internals(local_internals *this)

{
  internals *piVar1;
  mapped_type *ppvVar2;
  shared_loader_life_support_data *this_00;
  allocator local_39;
  key_type local_38;
  
  (this->registered_types_cpp)._M_h._M_buckets = &(this->registered_types_cpp)._M_h._M_single_bucket
  ;
  (this->registered_types_cpp)._M_h._M_bucket_count = 1;
  (this->registered_types_cpp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registered_types_cpp)._M_h._M_element_count = 0;
  (this->registered_types_cpp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registered_types_cpp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registered_types_cpp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->registered_exception_translators).
  super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
  this->loader_life_support_tls_key = (Py_tss_t *)0x0;
  piVar1 = get_internals();
  std::__cxx11::string::string((string *)&local_38,"_life_support",&local_39);
  ppvVar2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&piVar1->shared_data,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = (shared_loader_life_support_data *)*ppvVar2;
  if (this_00 == (shared_loader_life_support_data *)0x0) {
    this_00 = (shared_loader_life_support_data *)operator_new(8);
    shared_loader_life_support_data::shared_loader_life_support_data(this_00);
    *ppvVar2 = this_00;
  }
  this->loader_life_support_tls_key = this_00->loader_life_support_tls_key;
  return;
}

Assistant:

local_internals() {
        auto &internals = get_internals();
        // Get or create the `loader_life_support_stack_key`.
        auto &ptr = internals.shared_data["_life_support"];
        if (!ptr) {
            ptr = new shared_loader_life_support_data;
        }
        loader_life_support_tls_key
            = static_cast<shared_loader_life_support_data *>(ptr)->loader_life_support_tls_key;
    }